

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O0

void __thiscall test_skeleton_iterator_edge2::test_method(test_skeleton_iterator_edge2 *this)

{
  undefined8 uVar1;
  type_conflict1 tVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  void *this_00;
  lazy_ostream *prev;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2a8;
  assertion_result local_288;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  Vertex_handle local_24c;
  undefined1 local_248 [4];
  Vertex_handle neighbor;
  Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __end1;
  Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  __begin1;
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  local_1c0;
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  *local_140;
  Complex_neighbors_vertices_range *__range1;
  undefined1 local_130 [4];
  int num_neigbors_seen;
  Vertex_handle local_118;
  Vertex_handle local_114;
  Edge_handle local_110;
  Vertex_handle local_f8;
  Vertex_handle local_f4;
  Edge_handle local_f0;
  Vertex_handle local_d8 [5];
  Vertex_handle local_c4;
  int local_c0;
  int local_bc;
  int j;
  int i;
  Complex complex;
  int n;
  test_skeleton_iterator_edge2 *this_local;
  
  complex.blocker_map_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 10;
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)&j
             ,10,(Visitor *)0x0);
  for (local_bc = 0; local_bc < 10; local_bc = local_bc + 1) {
    for (local_c0 = 0; local_c0 < local_bc; local_c0 = local_c0 + 1) {
      Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
                (&local_c4,local_bc);
      Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
                (local_d8,local_c0);
      Gudhi::skeleton_blocker::
      Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
      add_edge_without_blockers
                (&local_f0,
                 (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                  *)&j,local_c4,local_d8[0]);
    }
  }
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_f4,2)
  ;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle(&local_f8,3)
  ;
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_edge
            (&local_110,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)&j
             ,local_f4,local_f8);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_114,3);
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            (&local_118,5);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_edge
            ((Edge_handle *)local_130,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)&j
             ,local_114,local_118);
  poVar5 = std::operator<<((ostream *)&std::clog,"complex.num_edges():");
  iVar4 = Gudhi::skeleton_blocker::
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
          num_edges((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                     *)&j);
  this_00 = (void *)std::ostream::operator<<(poVar5,iVar4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  __range1._4_4_ = 0;
  Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)((long)&__begin1.end_.m_g + 4),2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::vertex_range
            ((Complex_neighbors_vertices_range *)&local_1c0,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)&j
             ,__begin1.end_.m_g._4_4_);
  local_140 = &local_1c0;
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
           *)&__end1.end_.m_g,local_140);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
         *)local_248,local_140);
  while (tVar2 = boost::iterators::operator!=
                           ((iterator_facade<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                             *)&__end1.end_.m_g,
                            (iterator_facade<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long>
                             *)local_248), tVar2) {
    local_24c.vertex =
         (boost_vertex_handle)
         boost::iterators::detail::
         iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
         ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                      *)&__end1.end_.m_g);
    poVar5 = std::operator<<((ostream *)&std::clog,"neighbor");
    poVar5 = Gudhi::skeleton_blocker::operator<<(poVar5,&local_24c);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __range1._4_4_ = __range1._4_4_ + 1;
    boost::iterators::detail::
    iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Neighbors_vertices_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                  *)&__end1.end_.m_g);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
               ,0x81);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0x96,&local_270);
    boost::test_tools::assertion_result::assertion_result(&local_288,__range1._4_4_ == 8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,"num_neigbors_seen == 8",0x16);
    boost::unit_test::operator<<(&local_2a8,prev,&local_2b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
               ,0x81);
    boost::test_tools::tt_detail::report_assertion(&local_288,&local_2a8,&local_2c8,0x96,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2a8);
    boost::test_tools::assertion_result::~assertion_result(&local_288);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex
            ((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)&j
            );
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_iterator_edge2) {
  const int n = 10;
  Complex complex(n);
  for (int i = 0; i < n; i++)
    for (int j = 0; j < i; j++)
      complex.add_edge_without_blockers(Vertex_handle(i), Vertex_handle(j));
  complex.remove_edge(Vertex_handle(2), Vertex_handle(3));
  complex.remove_edge(Vertex_handle(3), Vertex_handle(5));
  std::clog << "complex.num_edges():" << complex.num_edges() << std::endl;
  int num_neigbors_seen = 0;
  for (auto neighbor : complex.vertex_range(Vertex_handle(2))) {
    std::clog << "neighbor" << neighbor << std::endl;
    ++num_neigbors_seen;
  }
  BOOST_CHECK(num_neigbors_seen == 8);
}